

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsServerThread::~TadsServerThread(TadsServerThread *this)

{
  OS_Thread *in_RDI;
  
  (in_RDI->super_CVmWeakRefable).super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsServerThread_0042c210;
  (in_RDI->super_OS_Waitable)._vptr_OS_Waitable = (_func_int **)&PTR__TadsServerThread_0042c248;
  CVmRefCntObj::release_ref((CVmRefCntObj *)in_RDI);
  CVmWeakRefable::release_ref(&in_RDI->super_CVmWeakRefable);
  CVmRefCntObj::release_ref((CVmRefCntObj *)in_RDI);
  CVmRefCntObj::release_ref((CVmRefCntObj *)in_RDI);
  if (in_RDI[1].tid != 0) {
    free((void *)in_RDI[1].tid);
  }
  OS_Thread::~OS_Thread(in_RDI);
  return;
}

Assistant:

~TadsServerThread()
    {
        /* release our resources */
        socket->release_ref();
        listener->release_ref();
        mutex->release_ref();
        state->release_ref();
        if (client_ip != 0)
            t3free(client_ip);
    }